

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O0

void Mpm_ManComputeEstRefs(Mpm_Man_t *p)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int local_24;
  int i;
  int *pEstRefs;
  int *pMapRefs;
  Mpm_Man_t *p_local;
  
  piVar2 = Vec_IntArray(&p->vMapRefs);
  piVar3 = Vec_IntArray(&p->vEstRefs);
  if (p->fMainRun != 0) {
    local_24 = 0;
    while( true ) {
      iVar1 = Mig_ManObjNum(p->pMig);
      if (iVar1 <= local_24) break;
      piVar3[local_24] = (piVar3[local_24] + piVar2[local_24] * 100) / 2;
      local_24 = local_24 + 1;
    }
    return;
  }
  __assert_fail("p->fMainRun",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                ,0x2db,"void Mpm_ManComputeEstRefs(Mpm_Man_t *)");
}

Assistant:

static inline void Mpm_ManComputeEstRefs( Mpm_Man_t * p )
{
    int * pMapRefs  = Vec_IntArray( &p->vMapRefs );
    int * pEstRefs  = Vec_IntArray( &p->vEstRefs );
    int i;
    assert( p->fMainRun );
//  pObj->EstRefs = (float)((2.0 * pObj->EstRefs + pObj->nRefs) / 3.0);
    for ( i = 0; i < Mig_ManObjNum(p->pMig); i++ )
        pEstRefs[i] = (1 * pEstRefs[i] + MPM_UNIT_REFS * pMapRefs[i]) / 2;
}